

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

bool __thiscall
slang::IntervalMapDetails::
NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_true>_>
::canUnionRight(NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_true>_>
                *this,uint32_t i,uint32_t size,interval<unsigned_long> *key)

{
  interval<unsigned_long> *piVar1;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  LeafNode<unsigned_long,_std::monostate,_11U,_true> *in_RDI;
  LeafNode<unsigned_long,_std::monostate,_11U,_true> *self;
  bool local_29;
  
  local_29 = false;
  if (in_ESI < in_EDX) {
    piVar1 = LeafNode<unsigned_long,_std::monostate,_11U,_true>::keyAt(in_RDI,in_ESI);
    local_29 = piVar1->left <= *(long *)(in_RCX + 8) + 1U;
  }
  return local_29;
}

Assistant:

bool canUnionRight(uint32_t i, uint32_t size, const interval<TKey>& key) const {
        SLANG_ASSERT(i <= size);
        SLANG_ASSERT(size <= TDerived::Capacity);
        auto& self = *static_cast<const TDerived*>(this);

        // This function is called under the assumption that we've already done
        // a findUnionLeft and so all further keys have left values (and therefore
        // also right values) >= our search key left. Therefore we only need to check
        // one thing, which is whether the very next item overlaps or not.
        return i < size && self.keyAt(i).left <= key.right + 1;
    }